

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O2

char * TEST_many_options_custom(void)

{
  int iVar1;
  char *pcVar2;
  long lStack_300;
  cargo_t cargo;
  char *args [2];
  _test_rect_t rect;
  char optname [256];
  int vals [100];
  
  iVar1 = cargo_init(&cargo,0,"program");
  if (iVar1 == 0) {
    args[0] = "program";
    args[1] = "--help";
    lStack_300 = 0;
    do {
      while (lStack_300 != 0x32) {
        if (lStack_300 == 0x65) {
          pcVar2 = (char *)0x0;
          cargo_parse(cargo,0,1,2,args);
          cargo_print_usage(cargo,CARGO_USAGE_FULL);
          goto LAB_00115844;
        }
        cargo_snprintf(optname,0x100,"--opto%02d",lStack_300 + 1);
        iVar1 = cargo_add_option(cargo,0,optname,
                                 "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. Ut enim ad minim veniam, quis nostrud exercitation ullamco laboris nisi ut aliquip ex ea commodo consequat. Duis aute irure dolor in reprehenderit in voluptate velit esse cillum dolore eu fugiat nulla pariatur. Excepteur sint occaecat cupidatat non proident, sunt in culpa qui officia deserunt mollit anim id est laborum."
                                 ,"i",vals + lStack_300);
        lStack_300 = lStack_300 + 1;
        if (iVar1 != 0) {
          pcVar2 = "Failed to add option";
          goto LAB_00115844;
        }
      }
      iVar1 = cargo_add_option(cargo,0,"--alpha","The alpha","[c]#",_test_cb_fixed_array_no_count,
                               &rect,0,4);
      lStack_300 = 0x33;
    } while (iVar1 == 0);
    pcVar2 = "Failed to add options";
LAB_00115844:
    cargo_destroy(&cargo);
  }
  else {
    pcVar2 = "Failed to init cargo";
  }
  return pcVar2;
}

Assistant:

_TEST_START(TEST_many_options_custom)
{
    size_t j = 0;
    _test_rect_t rect;
    #define OPT_COUNT 100
    int vals[OPT_COUNT];
    char optname[256];
    char *args[] = { "program", "--help" };

    // This reproduces a bug seen on the raspberry pi where
    // you get a SIGSEV because the internal list for a custom
    // variable would be freed and then target count was dereferenced
    // (which now was freed).
    for (j = 0; j < OPT_COUNT + 1; j++)
    {
        if (j == (OPT_COUNT / 2))
        {
            ret |= cargo_add_option(cargo, 0, "--alpha", "The alpha", "[c]#",
                            _test_cb_fixed_array_no_count,
                            &rect, NULL, 4);
            cargo_assert(ret == 0, "Failed to add options");
            continue;
        }
        cargo_snprintf(optname, sizeof(optname), "--opto%02d",  j+1);
        ret |= cargo_add_option(cargo, 0, optname, LOREM_IPSUM, "i", &vals[j]);
        cargo_assert(ret == 0, "Failed to add option");
    }

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);

    cargo_print_usage(cargo, 0);

    _TEST_CLEANUP();
}